

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_map_suite.cpp
# Opt level: O0

void api_suite::api_make(void)

{
  iterator first_begin;
  iterator first_end;
  iterator second_begin;
  iterator second_end;
  pair<int,_int> (*in_RDX) [4];
  undefined1 local_68 [8];
  array<vista::pair<int,_int>,_4UL> expect;
  undefined1 local_28 [8];
  constant_map<int,_int,_4UL,_std::less<int>_> map;
  
  expect._M_elems[3].first = 0x16;
  expect._M_elems[3].second = 2;
  vista::make_constant_map<int,int,4ul,std::less<int>>
            ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,(vista *)(expect._M_elems + 3)
             ,in_RDX);
  local_68._0_4_ = 0xb;
  local_68._4_4_ = 1;
  expect._M_elems[0].first = 0x16;
  expect._M_elems[0].second = 2;
  expect._M_elems[1].first = 0x21;
  expect._M_elems[1].second = 3;
  expect._M_elems[2].first = 0x2c;
  expect._M_elems[2].second = 4;
  first_begin = std::array<vista::pair<int,_int>,_4UL>::begin
                          ((array<vista::pair<int,_int>,_4UL> *)local_28);
  first_end = std::array<vista::pair<int,_int>,_4UL>::end
                        ((array<vista::pair<int,_int>,_4UL> *)local_28);
  second_begin = std::array<vista::pair<int,_int>,_4UL>::begin
                           ((array<vista::pair<int,_int>,_4UL> *)local_68);
  second_end = std::array<vista::pair<int,_int>,_4UL>::end
                         ((array<vista::pair<int,_int>,_4UL> *)local_68);
  boost::detail::test_all_eq_impl<std::ostream,vista::pair<int,int>*,vista::pair<int,int>*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x4b,"void api_suite::api_make()",first_begin,first_end,second_begin,second_end);
  return;
}

Assistant:

void api_make()
{
    auto map = make_constant_map<int, int>(
        {
            { 22, 2 },
            { 44, 4 },
            { 33, 3 },
            { 11, 1 }
        });
    {
        std::array<pair<int, int>, 4> expect = {
            pair<int, int>{ 11, 1 },
            pair<int, int>{ 22, 2 },
            pair<int, int>{ 33, 3 },
            pair<int, int>{ 44, 4 }
        };
        BOOST_TEST_ALL_EQ(map.begin(), map.end(),
                          expect.begin(), expect.end());
    }
}